

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

bool __thiscall
bssl::InplaceVector<unsigned_char,_12UL>::TryCopyFrom
          (InplaceVector<unsigned_char,_12UL> *this,Span<const_unsigned_char> in)

{
  size_t sVar1;
  size_t sVar2;
  iterator __first;
  iterator __last;
  uchar *__result;
  size_t sVar3;
  InplaceVector<unsigned_char,_12UL> *this_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  this_local = (InplaceVector<unsigned_char,_12UL> *)in.data_;
  sVar1 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
  sVar2 = capacity();
  if (sVar1 <= sVar2) {
    clear(this);
    __first = Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)&this_local);
    __last = Span<const_unsigned_char>::end((Span<const_unsigned_char> *)&this_local);
    __result = data(this);
    std::uninitialized_copy<unsigned_char_const*,unsigned_char*>(__first,__last,__result);
    sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
    this->size_ = (PackedSize<12UL>)sVar3;
  }
  return sVar1 <= sVar2;
}

Assistant:

[[nodiscard]] bool TryCopyFrom(Span<const T> in) {
    if (in.size() > capacity()) {
      return false;
    }
    clear();
    std::uninitialized_copy(in.begin(), in.end(), data());
    size_ = in.size();
    return true;
  }